

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O0

void SQCompilation::SQCompilationContext::vrenderDiagnosticHeader
               (DiagnosticsId diag,string *message,__va_list_tag *vargs)

{
  __gnuc_va_list in_RDX;
  char *in_RSI;
  uint in_EDI;
  char tempBuffer [2048];
  DiagnosticDescriptor *desc;
  char acStack_828 [2056];
  undefined8 *local_20;
  __gnuc_va_list local_18;
  char *local_10;
  
  local_20 = (undefined8 *)(diagnosticDescriptors + (ulong)in_EDI * 0x28);
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(acStack_828,0,0x800);
  snprintf(acStack_828,0x800,"%s: ",
           *(undefined8 *)(severityNames + (ulong)*(uint *)(local_20 + 1) * 8));
  std::__cxx11::string::append(local_10);
  if (0 < *(int *)(local_20 + 2)) {
    snprintf(acStack_828,0x800,"%c%d (%s) ",
             (ulong)(uint)(int)*(char *)((long)&severityPrefixes + (ulong)*(uint *)(local_20 + 1)),
             (ulong)*(uint *)(local_20 + 2),local_20[3]);
    std::__cxx11::string::append(local_10);
  }
  vsnprintf(acStack_828,0x800,(char *)*local_20,local_18);
  std::__cxx11::string::append(local_10);
  return;
}

Assistant:

void SQCompilationContext::vrenderDiagnosticHeader(enum DiagnosticsId diag, std::string &message, va_list vargs) {
  auto &desc = diagnosticDescriptors[diag];
  char tempBuffer[2048] = { 0 };

  snprintf(tempBuffer, sizeof tempBuffer, "%s: ", severityNames[desc.severity]);

  message.append(tempBuffer);

  if (desc.id > 0) {
    snprintf(tempBuffer, sizeof tempBuffer, "%c%d (%s) ", severityPrefixes[desc.severity], desc.id, desc.textId);
    message.append(tempBuffer);
  }

  vsnprintf(tempBuffer, sizeof tempBuffer, desc.format, vargs);

  message.append(tempBuffer);
}